

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

PtexFaceData * __thiscall
Ptex::v2_4::PtexReader::TiledReducedFace::getTile(TiledReducedFace *this,int tile)

{
  value_type pFVar1;
  TiledFaceBase *pTVar2;
  _func_int *p_Var3;
  code *pcVar4;
  PtexReader *this_00;
  long lVar5;
  ReduceFn *pRVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  size_t amount;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar15;
  ulong uVar16;
  undefined8 uStack_190;
  DataType aDStack_188 [2];
  undefined8 uStack_180;
  int iStack_174;
  size_t local_170;
  int aiStack_168 [2];
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  int local_148;
  int local_144;
  int local_140;
  undefined4 local_13c;
  void *local_138;
  void *local_130;
  long *local_128;
  int local_11c;
  void *local_118;
  bool local_10e;
  bool local_10d;
  int local_10c;
  TiledReducedFace *local_108;
  long *local_100;
  PtexFaceData *tileval_1;
  void *pvStack_f0;
  int i_1;
  char *dst;
  int local_e0;
  int dstepv;
  int dstepu;
  int dstride;
  int sstride;
  Res local_ca;
  int ptilevres;
  Res local_c2;
  int ptileures;
  int memsize;
  size_t local_b0;
  size_t newMemUsed;
  FaceData *newface;
  PtexFaceData *tileval;
  uint local_90;
  int i;
  int ptile;
  bool allConstant;
  PtexFaceData **tiles;
  int local_78;
  int ntilesval;
  int nv;
  int nu;
  int pntilesv;
  int pntilesu;
  FaceData **face;
  TiledReducedFace *pTStack_58;
  int tile_local;
  TiledReducedFace *this_local;
  undefined1 local_41;
  size_t local_40;
  undefined8 local_38;
  reference local_30;
  size_t local_28;
  undefined8 local_20;
  reference local_18;
  undefined1 *local_10;
  FaceData *pFVar14;
  
  uStack_180 = 0x10d76a;
  local_108 = this;
  face._4_4_ = tile;
  pTStack_58 = this;
  _pntilesv = std::
              vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
              ::operator[](&(this->super_TiledFaceBase)._tiles,(long)tile);
  if (*_pntilesv == (value_type)0x0) {
    uStack_180 = 0x10d798;
    nu = TiledFaceBase::ntilesu(local_108->_parentface);
    uStack_180 = 0x10d7ad;
    nv = TiledFaceBase::ntilesv(local_108->_parentface);
    ntilesval = nu / (local_108->super_TiledFaceBase)._ntilesu;
    local_78 = nv / (local_108->super_TiledFaceBase)._ntilesv;
    tiles._4_4_ = ntilesval * local_78;
    lVar5 = -((long)(ntilesval * local_78) * 8 + 0xfU & 0xfffffffffffffff0);
    _ptile = (undefined8 *)(&stack0xfffffffffffffe88 + lVar5);
    i._3_1_ = true;
    local_10c = (face._4_4_ / (local_108->super_TiledFaceBase)._ntilesu) * local_78 * nu;
    local_90 = local_10c + (face._4_4_ % (local_108->super_TiledFaceBase)._ntilesu) * ntilesval;
    tileval._4_4_ = 0;
    while (tileval._4_4_ < tiles._4_4_) {
      pTVar2 = local_108->_parentface;
      uVar16 = (ulong)local_90;
      p_Var3 = (pTVar2->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9];
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10d85d;
      iVar11 = (*p_Var3)(pTVar2,uVar16);
      pFVar14 = (FaceData *)CONCAT44(extraout_var,iVar11);
      _ptile[tileval._4_4_] = pFVar14;
      newface = pFVar14;
      local_10d = false;
      if ((i._3_1_ & 1) != 0) {
        p_Var3 = (pFVar14->super_PtexFaceData)._vptr_PtexFaceData[3];
        *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10d895;
        uVar12 = (*p_Var3)();
        local_10d = false;
        if ((uVar12 & 1) != 0) {
          local_10e = true;
          if (tileval._4_4_ != 0) {
            pcVar4 = *(code **)(*(long *)*_ptile + 0x30);
            *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10d8c4;
            local_118 = (void *)(*pcVar4)();
            p_Var3 = (newface->super_PtexFaceData)._vptr_PtexFaceData[6];
            *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10d8d8;
            iVar13 = (*p_Var3)();
            pvVar7 = local_118;
            iVar11 = (local_108->super_TiledFaceBase)._pixelsize;
            *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10d8f2;
            iVar11 = memcmp(pvVar7,(void *)CONCAT44(extraout_var_00,iVar13),(long)iVar11);
            local_10e = iVar11 == 0;
          }
          local_10d = local_10e;
        }
      }
      i._3_1_ = local_10d;
      tileval._4_4_ = tileval._4_4_ + 1;
      if (tileval._4_4_ % ntilesval == 0) {
        local_11c = (nu - ntilesval) + 1;
      }
      else {
        local_11c = 1;
      }
      local_90 = local_11c + local_90;
    }
    newMemUsed = 0;
    local_b0 = 0;
    if ((bool)i._3_1_ == false) {
      local_13c = (local_108->super_TiledFaceBase)._pixelsize;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10da5c;
      iVar11 = Res::size(*(Res **)((long)aiStack_168 + lVar5 + -8));
      ptileures = local_13c * iVar11;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10da77;
      local_138 = operator_new(0x18);
      local_c2 = (local_108->super_TiledFaceBase)._tileres;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10daab;
      PackedFace::PackedFace
                (*(PackedFace **)((long)&local_148 + lVar5),*(Res *)((long)&local_13c + lVar5 + 2),
                 *(int *)((long)&local_150 + lVar5 + 4),*(int *)((long)&local_150 + lVar5));
      newMemUsed = (size_t)local_138;
      local_b0 = (long)ptileures + 0x18;
      pTVar2 = local_108->_parentface;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10dadd;
      local_ca = TiledFaceBase::tileres(pTVar2);
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10daf0;
      ptilevres = Res::u(&local_ca);
      pTVar2 = local_108->_parentface;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10db08;
      dstride._2_2_ = TiledFaceBase::tileres(pTVar2);
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10db1b;
      sstride = Res::v((Res *)((long)&dstride + 2));
      dstepu = ptilevres * (local_108->super_TiledFaceBase)._pixelsize;
      pTVar2 = &local_108->super_TiledFaceBase;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10db41;
      local_140 = Res::u(&pTVar2->_tileres);
      local_140 = local_140 * (local_108->super_TiledFaceBase)._pixelsize;
      local_e0 = local_140 / ntilesval;
      pTVar2 = &local_108->super_TiledFaceBase;
      dstepv = local_140;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10db77;
      iVar11 = Res::v(&pTVar2->_tileres);
      dst._4_4_ = (local_140 * iVar11) / local_78 - local_e0 * (ntilesval + -1);
      pcVar4 = *(code **)(*(long *)newMemUsed + 0x30);
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10dbaa;
      pvStack_f0 = (void *)(*pcVar4)();
      tileval_1._4_4_ = 0;
      while (tileval_1._4_4_ < tiles._4_4_) {
        local_100 = (long *)_ptile[tileval_1._4_4_];
        pcVar4 = *(code **)(*local_100 + 0x18);
        *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10dbed;
        uVar16 = (*pcVar4)();
        if ((uVar16 & 1) == 0) {
          local_160 = local_108->_reducefn;
          pcVar4 = *(code **)(*local_100 + 0x30);
          *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10dccb;
          pvVar15 = (void *)(*pcVar4)();
          iVar10 = ptilevres;
          iVar9 = sstride;
          iVar8 = dstepu;
          iVar13 = dstepv;
          pvVar7 = pvStack_f0;
          pRVar6 = local_160;
          iVar11 = (local_108->super_TiledFaceBase)._nchan;
          *(DataType *)((long)aDStack_188 + lVar5) = (local_108->super_TiledFaceBase)._dt;
          *(int *)((long)&uStack_180 + lVar5) = iVar11;
          *(undefined8 *)((long)&uStack_190 + lVar5) = 0x10dd13;
          (*pRVar6)(pvVar15,iVar8,iVar10,iVar9,pvVar7,iVar13,
                    *(DataType *)((long)aDStack_188 + lVar5),*(int *)((long)&uStack_180 + lVar5));
        }
        else {
          pcVar4 = *(code **)(*local_100 + 0x30);
          *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10dc03;
          local_158 = (*pcVar4)();
          local_150 = pvStack_f0;
          local_144 = dstepv;
          pTVar2 = &local_108->super_TiledFaceBase;
          *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10dc34;
          local_148 = Res::u(&pTVar2->_tileres);
          local_148 = local_148 / ntilesval;
          pTVar2 = &local_108->super_TiledFaceBase;
          *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10dc4e;
          Res::v(&pTVar2->_tileres);
          *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10dc7f;
          PtexUtils::fill(*(void **)((long)&local_150 + lVar5),*(void **)((long)&local_158 + lVar5),
                          *(int *)((long)&local_160 + lVar5 + 4),*(int *)((long)&local_160 + lVar5),
                          *(int *)((long)aiStack_168 + lVar5 + 4),
                          *(int *)((long)aiStack_168 + lVar5));
        }
        tileval_1._4_4_ = tileval_1._4_4_ + 1;
        if (tileval_1._4_4_ % ntilesval == 0) {
          aiStack_168[1] = dst._4_4_;
        }
        else {
          aiStack_168[1] = local_e0;
        }
        pvStack_f0 = (void *)((long)pvStack_f0 + (long)aiStack_168[1]);
      }
    }
    else {
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10d999;
      local_128 = (long *)operator_new(0x18);
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10d9b5;
      ConstantFace::ConstantFace
                (*(ConstantFace **)((long)aiStack_168 + lVar5 + -8),
                 *(int *)((long)&iStack_174 + lVar5));
      newMemUsed = (size_t)local_128;
      local_b0 = (long)(local_108->super_TiledFaceBase)._pixelsize + 0x18;
      pcVar4 = *(code **)(*local_128 + 0x30);
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10d9e8;
      local_130 = (void *)(*pcVar4)();
      pcVar4 = *(code **)(*(long *)*_ptile + 0x30);
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10d9fc;
      pvVar15 = (void *)(*pcVar4)();
      pvVar7 = local_130;
      iVar11 = (local_108->super_TiledFaceBase)._pixelsize;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10da16;
      memcpy(pvVar7,pvVar15,(long)iVar11);
    }
    amount = local_b0;
    local_30 = _pntilesv;
    local_38 = 0;
    local_40 = newMemUsed;
    local_10 = &local_41;
    local_18 = _pntilesv;
    local_20 = 0;
    local_28 = newMemUsed;
    LOCK();
    pFVar1 = *_pntilesv;
    if (pFVar1 == (value_type)0x0) {
      *_pntilesv = (value_type)newMemUsed;
    }
    UNLOCK();
    if (pFVar1 == (value_type)0x0) {
      this_00 = (local_108->super_TiledFaceBase)._reader;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10de00;
      increaseMemUsed(this_00,amount);
    }
    else {
      local_170 = newMemUsed;
      if (newMemUsed != 0) {
        pcVar4 = *(code **)(*(long *)newMemUsed + 8);
        *(undefined8 *)((long)&uStack_180 + lVar5) = 0x10dde7;
        (*pcVar4)();
      }
    }
    this_local = (TiledReducedFace *)*_pntilesv;
  }
  else {
    this_local = (TiledReducedFace *)*_pntilesv;
  }
  return (PtexFaceData *)this_local;
}

Assistant:

PtexFaceData* PtexReader::TiledReducedFace::getTile(int tile)
{
    FaceData*& face = _tiles[tile];
    if (face) {
        return face;
    }

    // first, get all parent tiles for this tile
    // and check if they are constant (with the same value)
    int pntilesu = _parentface->ntilesu();
    int pntilesv = _parentface->ntilesv();
    int nu = pntilesu / _ntilesu; // num parent tiles for this tile in u dir
    int nv = pntilesv / _ntilesv; // num parent tiles for this tile in v dir

    int ntilesval = nu*nv; // num parent tiles for this tile
    PtexFaceData** tiles = (PtexFaceData**) alloca(ntilesval * sizeof(PtexFaceData*));
    bool allConstant = true;
    int ptile = (tile/_ntilesu) * nv * pntilesu + (tile%_ntilesu) * nu;
    for (int i = 0; i < ntilesval;) {
        PtexFaceData* tileval = tiles[i] = _parentface->getTile(ptile);
        allConstant = (allConstant && tileval->isConstant() &&
                       (i==0 || (0 == memcmp(tiles[0]->getData(), tileval->getData(),
                                             _pixelsize))));
        i++;
        ptile += (i%nu)? 1 : pntilesu - nu + 1;
    }

    FaceData* newface = 0;
    size_t newMemUsed = 0;
    if (allConstant) {
        // allocate a new constant face
        newface = new ConstantFace(_pixelsize);
        newMemUsed = sizeof(ConstantFace) + _pixelsize;
        memcpy(newface->getData(), tiles[0]->getData(), _pixelsize);
    }
    else {
        // allocate a new packed face for the tile
        int memsize = _pixelsize*_tileres.size();
        newface = new PackedFace(_tileres, _pixelsize, memsize);
        newMemUsed = sizeof(PackedFace) + memsize;

        // generate reduction from parent tiles
        int ptileures = _parentface->tileres().u();
        int ptilevres = _parentface->tileres().v();
        int sstride = ptileures * _pixelsize;
        int dstride = _tileres.u() * _pixelsize;
        int dstepu = dstride/nu;
        int dstepv = dstride*_tileres.v()/nv - dstepu*(nu-1);

        char* dst = (char*) newface->getData();
        for (int i = 0; i < ntilesval;) {
            PtexFaceData* tileval = tiles[i];
            if (tileval->isConstant())
                PtexUtils::fill(tileval->getData(), dst, dstride,
                                _tileres.u()/nu, _tileres.v()/nv,
                                _pixelsize);
            else
                _reducefn(tileval->getData(), sstride, ptileures, ptilevres,
                          dst, dstride, _dt, _nchan);
            i++;
            dst += (i%nu) ? dstepu : dstepv;
        }
    }

    if (!AtomicCompareAndSwap(&face, (FaceData*)0, newface)) {
        delete newface;
    }
    else {
        _reader->increaseMemUsed(newMemUsed);
    }

    return face;
}